

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CosineExpression.hpp
# Opt level: O3

string * __thiscall
Kandinsky::CosineExpression::toString_abi_cxx11_
          (string *__return_storage_ptr__,CosineExpression *this,bool evaluate)

{
  element_type *peVar1;
  long lVar2;
  long *plVar3;
  long *plVar4;
  size_type *psVar5;
  undefined7 in_register_00000011;
  long *local_50;
  long local_48;
  long local_40;
  long lStack_38;
  undefined1 *local_30 [2];
  undefined1 local_20 [16];
  
  peVar1 = (this->super_UnaryExpression).m_arg.
           super___shared_ptr<Kandinsky::BaseExpression,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  (*peVar1->_vptr_BaseExpression[5])(local_30,peVar1,CONCAT71(in_register_00000011,evaluate));
  plVar3 = (long *)std::__cxx11::string::replace((ulong)local_30,0,(char *)0x0,0x10f4ae);
  plVar4 = plVar3 + 2;
  if ((long *)*plVar3 == plVar4) {
    local_40 = *plVar4;
    lStack_38 = plVar3[3];
    local_50 = &local_40;
  }
  else {
    local_40 = *plVar4;
    local_50 = (long *)*plVar3;
  }
  local_48 = plVar3[1];
  *plVar3 = (long)plVar4;
  plVar3[1] = 0;
  *(undefined1 *)(plVar3 + 2) = 0;
  plVar3 = (long *)std::__cxx11::string::append((char *)&local_50);
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  psVar5 = (size_type *)(plVar3 + 2);
  if ((size_type *)*plVar3 == psVar5) {
    lVar2 = plVar3[3];
    (__return_storage_ptr__->field_2)._M_allocated_capacity = *psVar5;
    *(long *)((long)&__return_storage_ptr__->field_2 + 8) = lVar2;
  }
  else {
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)*plVar3;
    (__return_storage_ptr__->field_2)._M_allocated_capacity = *psVar5;
  }
  __return_storage_ptr__->_M_string_length = plVar3[1];
  *plVar3 = (long)psVar5;
  plVar3[1] = 0;
  *(undefined1 *)(plVar3 + 2) = 0;
  if (local_50 != &local_40) {
    operator_delete(local_50);
  }
  if (local_30[0] != local_20) {
    operator_delete(local_30[0]);
  }
  return __return_storage_ptr__;
}

Assistant:

virtual std::string toString(bool evaluate = false) const
        {
            return "cos(" + m_arg->toString(evaluate) + ")";
        }